

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_unarrow_sat32_arm(CPUARMState *env,uint64_t x)

{
  uint32_t uVar1;
  
  if (-1 < (long)x) {
    uVar1 = (uint32_t)x;
    if (x >> 0x20 != 0) {
      (env->vfp).qc[0] = 1;
      uVar1 = 0xffffffff;
    }
    return uVar1;
  }
  (env->vfp).qc[0] = 1;
  return 0;
}

Assistant:

uint32_t HELPER(neon_unarrow_sat32)(CPUARMState *env, uint64_t x)
{
    if (x & 0x8000000000000000ull) {
        SET_QC();
        return 0;
    }
    if (x > 0xffffffffu) {
        SET_QC();
        return 0xffffffffu;
    }
    return x;
}